

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall
mp::internal::SolverAppOptionParser::SolverAppOptionParser
          (SolverAppOptionParser *this,BasicSolver *s)

{
  Builder<mp::internal::SolverAppOptionParser> app_options;
  Builder<mp::BasicSolver> options;
  
  (this->currentOptionString)._M_dataplus._M_p = (pointer)&(this->currentOptionString).field_2;
  (this->currentOptionString)._M_string_length = 0;
  (this->currentOptionString).field_2._M_local_buf[0] = '\0';
  this->solver_ = s;
  (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).options_.super__Vector_base<mp::Option,_std::allocator<mp::Option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options_).sorted_ = true;
  this->echo_solver_options_ = true;
  app_options.options_ = &this->options_;
  app_options.handler_ = this;
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::ShowUsage>(&app_options,'?',"show usage and exit");
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::EndOptions>(&app_options,'-',"end of options");
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  AddWithParam<&mp::internal::SolverAppOptionParser::ShowSolverOptions>
            (&app_options,'=',"show solver options and exit");
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::ShowSolverOptionsASL>
            (&app_options,'a',"show solver options (ASL style, 1st synonyms if provided) and exit");
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::ShowSolveResults>
            (&app_options,'!',"show solve result codes");
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::DontEchoSolverOptions>
            (&app_options,'e',"suppress echoing of assignments");
  OptionList::Builder<mp::internal::SolverAppOptionParser>::
  Add<&mp::internal::SolverAppOptionParser::WantSol>
            (&app_options,'s',"write .sol file (without -AMPL)");
  options.options_ = &this->options_;
  options.handler_ = s;
  OptionList::Builder<mp::BasicSolver>::Add<&mp::BasicSolver::ShowVersion>
            (&options,'v',"show version and exit");
  OptionList::Builder<mp::BasicSolver>::Add<&mp::BasicSolver::ShowConstraintDescriptions>
            (&options,'c',"show constraint descriptions and exit");
  return;
}

Assistant:

SolverAppOptionParser::SolverAppOptionParser(BasicSolver &s)
  : solver_(s), echo_solver_options_(true) {
  // Add standard command-line options.
  OptionList::Builder<SolverAppOptionParser> app_options(options_, *this);
  app_options.Add<&SolverAppOptionParser::ShowUsage>(
        '?', "show usage and exit");
  app_options.Add<&SolverAppOptionParser::EndOptions>('-', "end of options");
  app_options.AddWithParam<&SolverAppOptionParser::ShowSolverOptions>(
        '=', "show solver options and exit");
  app_options.Add<&SolverAppOptionParser::ShowSolverOptionsASL>(
    'a', "show solver options (ASL style, 1st synonyms if provided) and exit");
  app_options.Add<&SolverAppOptionParser::ShowSolveResults>(
    '!', "show solve result codes");
  app_options.Add<&SolverAppOptionParser::DontEchoSolverOptions>(
        'e', "suppress echoing of assignments");
  app_options.Add<&SolverAppOptionParser::WantSol>(
        's', "write .sol file (without -AMPL)");
  OptionList::Builder<mp::BasicSolver> options(options_, s);
  options.Add<&mp::BasicSolver::ShowVersion>('v', "show version and exit");
  options.Add<&mp::BasicSolver::ShowConstraintDescriptions>('c',
                                             "show constraint descriptions and exit");
  // TODO: if solver supports functions add options -ix and -u
  // "ix", "import user-defined functions from x; -i? gives details",
  // "u",  "just show available user-defined functions"
}